

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdiAreaPrivate::updateActiveWindow(QMdiAreaPrivate *this,int removedIndex,bool activeRemoved)

{
  bool bVar1;
  QMdiAreaPrivate *this_00;
  qsizetype qVar2;
  QMdiSubWindow *pQVar3;
  byte in_DL;
  int in_ESI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *next;
  int *index;
  QMdiAreaPrivate *in_stack_00000028;
  int i;
  QSignalBlocker blocker;
  qsizetype in_stack_ffffffffffffffa8;
  QSignalBlocker *in_stack_ffffffffffffffc0;
  QMdiSubWindow *in_stack_ffffffffffffffc8;
  int local_2c;
  undefined1 *in_stack_ffffffffffffffe8;
  QTabBar *in_stack_fffffffffffffff0;
  QMdiAreaPrivate *this_01;
  
  this_01 = *(QMdiAreaPrivate **)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  while( true ) {
    this_00 = (QMdiAreaPrivate *)(long)local_2c;
    qVar2 = QList<int>::size(&in_RDI->indicesToActivatedChildren);
    if (qVar2 <= (long)this_00) break;
    in_stack_ffffffffffffffc8 =
         (QMdiSubWindow *)QList<int>::operator[]((QList<int> *)this_00,in_stack_ffffffffffffffa8);
    if (in_ESI < *(int *)&in_stack_ffffffffffffffc8->super_QWidget) {
      *(int *)&in_stack_ffffffffffffffc8->super_QWidget =
           *(int *)&in_stack_ffffffffffffffc8->super_QWidget + -1;
    }
    local_2c = local_2c + 1;
  }
  if ((in_RDI->tabBar != (QMdiAreaTabBar *)0x0) && (-1 < in_ESI)) {
    in_stack_ffffffffffffffe8 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffff0 = (QTabBar *)&DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker(in_stack_ffffffffffffffc0,(QObject *)in_RDI);
    QTabBar::removeTab(in_stack_fffffffffffffff0,this._4_4_);
    updateTabBarGeometry(in_stack_00000028);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)this_00);
  }
  bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x611dd1);
  if (bVar1) {
    in_RDI->showActiveWindowMaximized = false;
    resetActiveWindow(this_00,(QMdiSubWindow *)in_RDI);
  }
  else {
    if (-1 < in_RDI->indexToHighlighted) {
      if (in_RDI->indexToHighlighted == in_ESI) {
        hideRubberBand(this_00);
      }
      else if (in_ESI < in_RDI->indexToHighlighted) {
        in_RDI->indexToHighlighted = in_RDI->indexToHighlighted + -1;
      }
    }
    if (((in_DL & 1) != 0) &&
       (pQVar3 = nextVisibleSubWindow
                           (this_01,(int)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                            (WindowOrder)in_stack_fffffffffffffff0,
                            (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                            (int)in_stack_ffffffffffffffe8), pQVar3 != (QMdiSubWindow *)0x0)) {
      activateWindow(in_RDI,in_stack_ffffffffffffffc8);
    }
  }
  if (*(QMdiAreaPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::updateActiveWindow(int removedIndex, bool activeRemoved)
{
    Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());

    // Update indices list first so that we don't rely
    for (int i = 0; i < indicesToActivatedChildren.size(); ++i) {
        int &index = indicesToActivatedChildren[i];
        if (index > removedIndex)
            --index;
    }

#if QT_CONFIG(tabbar)
    if (tabBar && removedIndex >= 0) {
        const QSignalBlocker blocker(tabBar);
        tabBar->removeTab(removedIndex);
        updateTabBarGeometry();
    }
#endif

    if (childWindows.isEmpty()) {
        showActiveWindowMaximized = false;
        resetActiveWindow();
        return;
    }

    if (indexToHighlighted >= 0) {
#if QT_CONFIG(rubberband)
        // Hide rubber band if highlighted window is removed.
        if (indexToHighlighted == removedIndex)
            hideRubberBand();
        else
#endif
        // or update index if necessary.
        if (indexToHighlighted > removedIndex)
            --indexToHighlighted;
    }

    if (!activeRemoved)
        return;

    // Activate next window.
    QMdiSubWindow *next = nextVisibleSubWindow(0, activationOrder, removedIndex);
    if (next)
        activateWindow(next);
}